

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O0

double z_abs(doublecomplex *z)

{
  double dVar1;
  double local_30;
  double imag;
  double real;
  double temp;
  doublecomplex *z_local;
  
  imag = z->r;
  local_30 = z->i;
  if (imag < 0.0) {
    imag = -imag;
  }
  dVar1 = imag;
  if (local_30 < 0.0) {
    local_30 = -local_30;
  }
  if (imag < local_30) {
    imag = local_30;
    local_30 = dVar1;
  }
  if ((imag + local_30 != imag) || (NAN(imag + local_30) || NAN(imag))) {
    dVar1 = sqrt((local_30 / imag) * (local_30 / imag) + 1.0);
    z_local = (doublecomplex *)(imag * dVar1);
  }
  else {
    z_local = (doublecomplex *)imag;
  }
  return (double)z_local;
}

Assistant:

double z_abs(doublecomplex *z)
{
    double temp;
    double real = z->r;
    double imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}